

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_error.c
# Opt level: O1

void skynet_error(skynet_context *context,char *msg,...)

{
  int iVar1;
  int iVar2;
  char in_AL;
  int iVar3;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char tmp [256];
  undefined8 local_228;
  void **local_220;
  undefined1 *local_218;
  skynet_context *local_208;
  skynet_message local_200;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  char local_138 [264];
  
  if (in_AL != '\0') {
    local_1b8 = in_XMM0_Qa;
    local_1a8 = in_XMM1_Qa;
    local_198 = in_XMM2_Qa;
    local_188 = in_XMM3_Qa;
    local_178 = in_XMM4_Qa;
    local_168 = in_XMM5_Qa;
    local_158 = in_XMM6_Qa;
    local_148 = in_XMM7_Qa;
  }
  local_1d8 = in_RDX;
  local_1d0 = in_RCX;
  local_1c8 = in_R8;
  local_1c0 = in_R9;
  if (skynet_error::logger == 0) {
    skynet_error::logger = skynet_handle_findname("logger");
  }
  if (skynet_error::logger != 0) {
    local_228 = 0x3000000010;
    local_220 = &ap[0].overflow_arg_area;
    local_218 = local_1e8;
    iVar3 = vsnprintf(local_138,0x100,msg,&local_228);
    if (iVar3 < 0x100) {
      __s = skynet_strdup(local_138);
    }
    else {
      __s = (char *)malloc(0x200);
      local_228 = 0x3000000010;
      local_220 = &ap[0].overflow_arg_area;
      local_218 = local_1e8;
      iVar3 = vsnprintf(__s,0x200,msg,&local_228);
      if (0x1ff < iVar3) {
        iVar4 = 0x200;
        local_208 = context;
        do {
          free(__s);
          iVar2 = iVar4 * 2;
          __s = (char *)malloc((long)iVar2);
          local_228 = 0x3000000010;
          local_220 = &ap[0].overflow_arg_area;
          local_218 = local_1e8;
          iVar3 = vsnprintf(__s,(long)iVar2,msg,&local_228);
          iVar1 = iVar4 * -2;
          context = local_208;
          iVar4 = iVar2;
        } while (SBORROW4(iVar3,iVar2) == iVar3 + iVar1 < 0);
      }
    }
    if (context == (skynet_context *)0x0) {
      local_200.source = 0;
    }
    else {
      local_200.source = skynet_context_handle(context);
    }
    local_200.session = 0;
    local_200.sz = (size_t)iVar3;
    local_200.data = __s;
    skynet_context_push(skynet_error::logger,&local_200);
  }
  return;
}

Assistant:

void 
skynet_error(struct skynet_context * context, const char *msg, ...) {
	static uint32_t logger = 0;
	if (logger == 0) {
		logger = skynet_handle_findname("logger");
	}
	if (logger == 0) {
		return;
	}

	char tmp[LOG_MESSAGE_SIZE];
	char *data = NULL;

	va_list ap;

	va_start(ap,msg);
	int len = vsnprintf(tmp, LOG_MESSAGE_SIZE, msg, ap);
	va_end(ap);
	if (len < LOG_MESSAGE_SIZE) {
		data = skynet_strdup(tmp);
	} else {
		int max_size = LOG_MESSAGE_SIZE;
		for (;;) {
			max_size *= 2;
			data = skynet_malloc(max_size);
			va_start(ap,msg);
			len = vsnprintf(data, max_size, msg, ap);
			va_end(ap);
			if (len < max_size) {
				break;
			}
			skynet_free(data);
		}
	}


	struct skynet_message smsg;
	if (context == NULL) {
		smsg.source = 0;
	} else {
		smsg.source = skynet_context_handle(context);
	}
	smsg.session = 0;
	smsg.data = data;
	smsg.sz = len | ((size_t)PTYPE_TEXT << MESSAGE_TYPE_SHIFT);
	skynet_context_push(logger, &smsg);
}